

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BER.h
# Opt level: O2

shared_ptr<BER_CONTAINER> __thiscall
ComplexType::addValueToList(ComplexType *this,shared_ptr<BER_CONTAINER> *newObj)

{
  __shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<BER_CONTAINER> sVar1;
  
  std::vector<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>::
  push_back((vector<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
             *)(newObj + 1),(value_type *)in_RDX);
  std::__shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2> *)this,in_RDX);
  sVar1.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_BER_CONTAINER;
  return (shared_ptr<BER_CONTAINER>)
         sVar1.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BER_CONTAINER> addValueToList(const std::shared_ptr<BER_CONTAINER>& newObj){
        this->values.push_back(newObj);
        return newObj;
    }